

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

bool __thiscall
testing::internal::TypedTestSuitePState::AddTestName
          (TypedTestSuitePState *this,char *file,int line,char *case_name,char *test_name)

{
  FILE *__stream;
  allocator local_a9;
  CodeLocation local_a8;
  string local_80 [32];
  pair<const_char_*,_testing::internal::CodeLocation> local_60;
  
  __stream = _stderr;
  if (this->registered_ != true) {
    std::__cxx11::string::string(local_80,file,&local_a9);
    std::__cxx11::string::string((string *)&local_a8,local_80);
    local_a8.line = line;
    local_60.first = test_name;
    CodeLocation::CodeLocation(&local_60.second,&local_a8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,testing::internal::CodeLocation>,std::_Select1st<std::pair<std::__cxx11::string_const,testing::internal::CodeLocation>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testing::internal::CodeLocation>>>
    ::_M_emplace_unique<std::pair<char_const*,testing::internal::CodeLocation>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,testing::internal::CodeLocation>,std::_Select1st<std::pair<std::__cxx11::string_const,testing::internal::CodeLocation>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testing::internal::CodeLocation>>>
                *)&this->registered_tests_,&local_60);
    std::__cxx11::string::~string((string *)&local_60.second);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string(local_80);
    return true;
  }
  FormatFileLocation_abi_cxx11_
            ((string *)&local_60,(internal *)file,(char *)(ulong)(uint)line,(int)case_name);
  fprintf(__stream,"%s Test %s must be defined before REGISTER_TYPED_TEST_SUITE_P(%s, ...).\n",
          local_60.first,test_name,case_name);
  std::__cxx11::string::~string((string *)&local_60);
  fflush(_stderr);
  posix::Abort();
}

Assistant:

bool AddTestName(const char* file, int line, const char* case_name,
                   const char* test_name) {
    if (registered_) {
      fprintf(stderr,
              "%s Test %s must be defined before "
              "REGISTER_TYPED_TEST_SUITE_P(%s, ...).\n",
              FormatFileLocation(file, line).c_str(), test_name, case_name);
      fflush(stderr);
      posix::Abort();
    }
    registered_tests_.insert(
        ::std::make_pair(test_name, CodeLocation(file, line)));
    return true;
  }